

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::format_uint<4u,char,fmt::v10::appender,unsigned__int128>
                   (appender out,unsigned___int128 value,int num_digits,bool upper)

{
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  type tVar1;
  detail *this;
  int in_ECX;
  int num_digits_00;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 uStack_98;
  char buffer [33];
  char *ptr;
  bool upper_local;
  int num_digits_local;
  unsigned___int128 value_local;
  appender out_local;
  
  tVar1 = to_unsigned<int>(in_ECX);
  this = (detail *)
         to_pointer<char>((buffer_appender<char>)
                          out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                          (ulong)tVar1);
  num_digits_00 = (int)CONCAT71(in_register_00000011,upper);
  if (this == (detail *)0x0) {
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    uStack_98 = 0;
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[0x18] = '\0';
    value_01._8_8_ = in_stack_ffffffffffffff50;
    value_01._0_8_ = in_stack_ffffffffffffff48;
    format_uint<4u,char,unsigned__int128>
              ((detail *)&uStack_98,(char *)CONCAT44(in_register_00000034,num_digits),
               (unsigned___int128)value_01,num_digits_00,SUB41(in_ECX,0));
    out_local = copy_str_noinline<char,char*,fmt::v10::appender>
                          ((char *)&uStack_98,buffer + (long)in_ECX + -8,out);
  }
  else {
    value_00._8_8_ = in_stack_ffffffffffffff50;
    value_00._0_8_ = in_stack_ffffffffffffff48;
    format_uint<4u,char,unsigned__int128>
              (this,(char *)CONCAT44(in_register_00000034,num_digits),(unsigned___int128)value_00,
               num_digits_00,SUB41(in_ECX,0));
    out_local.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR inline auto format_uint(It out, UInt value, int num_digits,
                                      bool upper = false) -> It {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1] = {};
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str_noinline<Char>(buffer, buffer + num_digits, out);
}